

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::BVHNIntersector1<8,_257,_true,_embree::avx512::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [32];
  undefined8 uVar10;
  ulong uVar11;
  byte bVar12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [32];
  StackItemT<embree::NodeRefPtr<8>_> *pSVar15;
  ulong uVar16;
  long lVar17;
  byte bVar18;
  ulong uVar19;
  byte bVar20;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar21;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  float fVar61;
  undefined4 uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  float fVar66;
  float fVar69;
  float fVar70;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar79;
  float fVar80;
  vfloat4 a0;
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar78 [64];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  long lStack_2580;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 auVar30 [16];
  undefined1 auVar48 [32];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr != 8) {
    aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar28 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
    auVar13 = ZEXT812(0) << 0x20;
    auVar31 = ZEXT816(0) << 0x40;
    auVar63._4_12_ = auVar13;
    auVar63._0_4_ = auVar28._0_4_;
    auVar26 = vrsqrt14ss_avx512f(auVar31,auVar63);
    fVar61 = auVar26._0_4_;
    pre.depth_scale = fVar61 * 1.5 - auVar28._0_4_ * 0.5 * fVar61 * fVar61 * fVar61;
    uVar1 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    fVar61 = (ray->super_RayK<1>).dir.field_0.m128[2];
    auVar76._0_4_ = aVar3.x * pre.depth_scale;
    auVar76._4_4_ = aVar3.y * pre.depth_scale;
    auVar76._8_4_ = aVar3.z * pre.depth_scale;
    auVar76._12_4_ = aVar3.field_3.w * pre.depth_scale;
    auVar26 = vshufpd_avx(auVar76,auVar76,1);
    auVar28 = vmovshdup_avx(auVar76);
    auVar95._8_4_ = 0x80000000;
    auVar95._0_8_ = 0x8000000080000000;
    auVar95._12_4_ = 0x80000000;
    auVar93._0_4_ = auVar28._0_4_ ^ 0x80000000;
    auVar28 = vunpckhps_avx(auVar76,auVar31);
    auVar93._4_12_ = auVar13;
    auVar29 = vshufps_avx(auVar28,auVar93,0x41);
    auVar28 = vdpps_avx(auVar29,auVar29,0x7f);
    auVar92._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
    auVar92._8_8_ = auVar95._8_8_ ^ auVar26._8_8_;
    auVar27 = vinsertps_avx(auVar92,auVar76,0x2a);
    auVar26 = vdpps_avx(auVar27,auVar27,0x7f);
    uVar10 = vcmpps_avx512vl(auVar26,auVar28,1);
    auVar28 = vpmovm2d_avx512vl(uVar10);
    auVar96._0_4_ = auVar28._0_4_;
    auVar96._4_4_ = auVar96._0_4_;
    auVar96._8_4_ = auVar96._0_4_;
    auVar96._12_4_ = auVar96._0_4_;
    uVar25 = vpmovd2m_avx512vl(auVar96);
    auVar28 = vpcmpeqd_avx(auVar96,auVar96);
    auVar26._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar28._4_4_;
    auVar26._0_4_ = (uint)((byte)uVar25 & 1) * auVar28._0_4_;
    auVar26._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar28._8_4_;
    auVar26._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar28._12_4_;
    auVar28 = vblendvps_avx(auVar27,auVar29,auVar26);
    auVar26 = vdpps_avx(auVar28,auVar28,0x7f);
    auVar27._4_12_ = auVar13;
    auVar27._0_4_ = auVar26._0_4_;
    auVar27 = vrsqrt14ss_avx512f(auVar31,auVar27);
    fVar66 = auVar27._0_4_;
    fVar66 = fVar66 * 1.5 - auVar26._0_4_ * 0.5 * fVar66 * fVar66 * fVar66;
    auVar58._0_4_ = auVar28._0_4_ * fVar66;
    auVar58._4_4_ = auVar28._4_4_ * fVar66;
    auVar58._8_4_ = auVar28._8_4_ * fVar66;
    auVar58._12_4_ = auVar28._12_4_ * fVar66;
    auVar28 = vshufps_avx(auVar58,auVar58,0xc9);
    auVar26 = vshufps_avx(auVar76,auVar76,0xc9);
    auVar94._0_4_ = auVar26._0_4_ * auVar58._0_4_;
    auVar94._4_4_ = auVar26._4_4_ * auVar58._4_4_;
    auVar94._8_4_ = auVar26._8_4_ * auVar58._8_4_;
    auVar94._12_4_ = auVar26._12_4_ * auVar58._12_4_;
    auVar28 = vfmsub231ps_fma(auVar94,auVar76,auVar28);
    auVar26 = vshufps_avx(auVar28,auVar28,0xc9);
    auVar28 = vdpps_avx(auVar26,auVar26,0x7f);
    auVar97._4_12_ = auVar13;
    auVar97._0_4_ = auVar28._0_4_;
    auVar27 = vrsqrt14ss_avx512f(auVar31,auVar97);
    fVar66 = auVar27._0_4_;
    fVar66 = fVar66 * 1.5 - fVar66 * fVar66 * fVar66 * auVar28._0_4_ * 0.5;
    auVar67._0_4_ = fVar66 * auVar26._0_4_;
    auVar67._4_4_ = fVar66 * auVar26._4_4_;
    auVar67._8_4_ = fVar66 * auVar26._8_4_;
    auVar67._12_4_ = fVar66 * auVar26._12_4_;
    auVar64._0_4_ = pre.depth_scale * auVar76._0_4_;
    auVar64._4_4_ = pre.depth_scale * auVar76._4_4_;
    auVar64._8_4_ = pre.depth_scale * auVar76._8_4_;
    auVar64._12_4_ = pre.depth_scale * auVar76._12_4_;
    auVar27 = vunpcklps_avx(auVar58,auVar64);
    auVar28 = vunpckhps_avx(auVar58,auVar64);
    auVar29 = vunpcklps_avx(auVar67,auVar31);
    auVar26 = vunpckhps_avx(auVar67,auVar31);
    pre.ray_space.vz.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar28,auVar26)
    ;
    pre.ray_space.vx.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar27,auVar29)
    ;
    pre.ray_space.vy.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar27,auVar29)
    ;
    pSVar21 = stack + 1;
    stack[0].dist = 0;
    auVar26 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar60 = ZEXT1664(auVar26);
    auVar27 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar28._8_4_ = 0x7fffffff;
    auVar28._0_8_ = 0x7fffffff7fffffff;
    auVar28._12_4_ = 0x7fffffff;
    auVar28 = vandps_avx512vl((undefined1  [16])aVar3,auVar28);
    auVar29._8_4_ = 0x219392ef;
    auVar29._0_8_ = 0x219392ef219392ef;
    auVar29._12_4_ = 0x219392ef;
    uVar25 = vcmpps_avx512vl(auVar28,auVar29,1);
    auVar68._8_4_ = 0x3f800000;
    auVar68._0_8_ = 0x3f8000003f800000;
    auVar68._12_4_ = 0x3f800000;
    auVar28 = vdivps_avx(auVar68,(undefined1  [16])aVar3);
    auVar29 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar24 = (bool)((byte)uVar25 & 1);
    auVar30._0_4_ = (uint)bVar24 * auVar29._0_4_ | (uint)!bVar24 * auVar28._0_4_;
    bVar24 = (bool)((byte)(uVar25 >> 1) & 1);
    auVar30._4_4_ = (uint)bVar24 * auVar29._4_4_ | (uint)!bVar24 * auVar28._4_4_;
    bVar24 = (bool)((byte)(uVar25 >> 2) & 1);
    auVar30._8_4_ = (uint)bVar24 * auVar29._8_4_ | (uint)!bVar24 * auVar28._8_4_;
    bVar24 = (bool)((byte)(uVar25 >> 3) & 1);
    auVar30._12_4_ = (uint)bVar24 * auVar29._12_4_ | (uint)!bVar24 * auVar28._12_4_;
    auVar31._8_4_ = 0x3f7ffffa;
    auVar31._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar31._12_4_ = 0x3f7ffffa;
    auVar31 = vmulps_avx512vl(auVar30,auVar31);
    auVar32._8_4_ = 0x3f800003;
    auVar32._0_8_ = 0x3f8000033f800003;
    auVar32._12_4_ = 0x3f800003;
    auVar32 = vmulps_avx512vl(auVar30,auVar32);
    auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
    auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    auVar36 = vbroadcastss_avx512vl(auVar31);
    auVar28 = vmovshdup_avx(auVar31);
    auVar37 = vbroadcastsd_avx512vl(auVar28);
    auVar41._8_4_ = 2;
    auVar41._0_8_ = 0x200000002;
    auVar41._12_4_ = 2;
    auVar41._16_4_ = 2;
    auVar41._20_4_ = 2;
    auVar41._24_4_ = 2;
    auVar41._28_4_ = 2;
    auVar29 = vshufpd_avx(auVar31,auVar31,1);
    auVar38 = vpermps_avx512vl(auVar41,ZEXT1632(auVar31));
    auVar39 = vbroadcastss_avx512vl(auVar32);
    auVar40._8_4_ = 1;
    auVar40._0_8_ = 0x100000001;
    auVar40._12_4_ = 1;
    auVar40._16_4_ = 1;
    auVar40._20_4_ = 1;
    auVar40._24_4_ = 1;
    auVar40._28_4_ = 1;
    auVar40 = vpermps_avx512vl(auVar40,ZEXT1632(auVar32));
    auVar41 = vpermps_avx512vl(auVar41,ZEXT1632(auVar32));
    uVar23 = (ulong)(auVar31._0_4_ < 0.0) * 0x20;
    uVar22 = (ulong)(auVar28._0_4_ < 0.0) << 5 | 0x40;
    uVar25 = (ulong)(auVar29._0_4_ < 0.0) << 5 | 0x80;
    auVar42 = vbroadcastss_avx512vl(auVar26);
    uVar62 = auVar27._0_4_;
    auVar55 = ZEXT3264(CONCAT428(uVar62,CONCAT424(uVar62,CONCAT420(uVar62,CONCAT416(uVar62,CONCAT412
                                                  (uVar62,CONCAT48(uVar62,CONCAT44(uVar62,uVar62))))
                                                  ))));
    auVar43 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar101 = ZEXT3264(auVar43);
    auVar43 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar102 = ZEXT3264(auVar43);
LAB_01c54643:
    if (pSVar21 != stack) {
      pSVar15 = pSVar21 + -1;
      auVar57 = ZEXT464(pSVar15->dist);
      pSVar21 = pSVar21 + -1;
      if ((float)pSVar15->dist <= (ray->super_RayK<1>).tfar) {
        uVar19 = (pSVar21->ptr).ptr;
LAB_01c5465f:
        do {
          if ((uVar19 & 0xf) == 0) {
            auVar43 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar23),auVar33);
            auVar43 = vmulps_avx512vl(auVar36,auVar43);
            auVar44 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar22),auVar34);
            auVar44 = vmulps_avx512vl(auVar37,auVar44);
            auVar43 = vmaxps_avx(auVar43,auVar44);
            auVar44 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar25),auVar35);
            auVar45 = vmulps_avx512vl(auVar38,auVar44);
            auVar44 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar19 + 0x40 + (uVar23 ^ 0x20)),
                                      auVar33);
            auVar44 = vmulps_avx512vl(auVar39,auVar44);
            auVar46 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar19 + 0x40 + (uVar22 ^ 0x20)),
                                      auVar34);
            auVar46 = vmulps_avx512vl(auVar40,auVar46);
            auVar44 = vminps_avx(auVar44,auVar46);
            auVar46 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar19 + 0x40 + (uVar25 ^ 0x20)),
                                      auVar35);
            auVar46 = vmulps_avx512vl(auVar41,auVar46);
            auVar45 = vmaxps_avx512vl(auVar45,auVar42);
            auVar43 = vmaxps_avx(auVar43,auVar45);
            auVar45 = vminps_avx(auVar46,auVar55._0_32_);
            auVar44 = vminps_avx(auVar44,auVar45);
          }
          else {
            if ((int)(uVar19 & 0xf) != 2) {
              auVar60 = ZEXT1664(auVar60._0_16_);
              (**(code **)((long)This->leafIntersector +
                          (ulong)*(byte *)(uVar19 & 0xfffffffffffffff0) * 0x40))(&pre,ray,context);
              auVar43 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
              auVar102 = ZEXT3264(auVar43);
              auVar43 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
              auVar101 = ZEXT3264(auVar43);
              fVar66 = (ray->super_RayK<1>).tfar;
              auVar55 = ZEXT3264(CONCAT428(fVar66,CONCAT424(fVar66,CONCAT420(fVar66,CONCAT416(fVar66
                                                  ,CONCAT412(fVar66,CONCAT48(fVar66,CONCAT44(fVar66,
                                                  fVar66))))))));
              break;
            }
            uVar16 = uVar19 & 0xfffffffffffffff0;
            auVar43 = *(undefined1 (*) [32])(uVar16 + 0x100);
            auVar78._0_4_ = fVar61 * auVar43._0_4_;
            auVar78._4_4_ = fVar61 * auVar43._4_4_;
            auVar78._8_4_ = fVar61 * auVar43._8_4_;
            auVar78._12_4_ = fVar61 * auVar43._12_4_;
            auVar78._16_4_ = fVar61 * auVar43._16_4_;
            auVar78._20_4_ = fVar61 * auVar43._20_4_;
            auVar78._28_36_ = auVar57._28_36_;
            auVar78._24_4_ = fVar61 * auVar43._24_4_;
            auVar44 = *(undefined1 (*) [32])(uVar16 + 0x120);
            auVar57._0_4_ = fVar61 * auVar44._0_4_;
            auVar57._4_4_ = fVar61 * auVar44._4_4_;
            auVar57._8_4_ = fVar61 * auVar44._8_4_;
            auVar57._12_4_ = fVar61 * auVar44._12_4_;
            auVar57._16_4_ = fVar61 * auVar44._16_4_;
            auVar57._20_4_ = fVar61 * auVar44._20_4_;
            auVar57._28_36_ = auVar60._28_36_;
            auVar57._24_4_ = fVar61 * auVar44._24_4_;
            auVar45 = *(undefined1 (*) [32])(uVar16 + 0x140);
            auVar47._4_4_ = fVar61 * auVar45._4_4_;
            auVar47._0_4_ = fVar61 * auVar45._0_4_;
            auVar47._8_4_ = fVar61 * auVar45._8_4_;
            auVar47._12_4_ = fVar61 * auVar45._12_4_;
            auVar47._16_4_ = fVar61 * auVar45._16_4_;
            auVar47._20_4_ = fVar61 * auVar45._20_4_;
            auVar47._24_4_ = fVar61 * auVar45._24_4_;
            auVar47._28_4_ = fVar61;
            auVar53._4_4_ = uVar2;
            auVar53._0_4_ = uVar2;
            auVar53._8_4_ = uVar2;
            auVar53._12_4_ = uVar2;
            auVar53._16_4_ = uVar2;
            auVar53._20_4_ = uVar2;
            auVar53._24_4_ = uVar2;
            auVar53._28_4_ = uVar2;
            auVar28 = vfmadd231ps_fma(auVar78._0_32_,auVar53,*(undefined1 (*) [32])(uVar16 + 0xa0));
            auVar26 = vfmadd231ps_fma(auVar57._0_32_,auVar53,*(undefined1 (*) [32])(uVar16 + 0xc0));
            auVar27 = vfmadd231ps_fma(auVar47,auVar53,*(undefined1 (*) [32])(uVar16 + 0xe0));
            auVar14._4_4_ = uVar1;
            auVar14._0_4_ = uVar1;
            auVar14._8_4_ = uVar1;
            auVar14._12_4_ = uVar1;
            auVar14._16_4_ = uVar1;
            auVar14._20_4_ = uVar1;
            auVar14._24_4_ = uVar1;
            auVar14._28_4_ = uVar1;
            auVar28 = vfmadd231ps_fma(ZEXT1632(auVar28),auVar14,
                                      *(undefined1 (*) [32])(uVar16 + 0x40));
            auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),auVar14,
                                      *(undefined1 (*) [32])(uVar16 + 0x60));
            auVar27 = vfmadd231ps_fma(ZEXT1632(auVar27),auVar14,
                                      *(undefined1 (*) [32])(uVar16 + 0x80));
            auVar98._8_4_ = 0x7fffffff;
            auVar98._0_8_ = 0x7fffffff7fffffff;
            auVar98._12_4_ = 0x7fffffff;
            auVar98._16_4_ = 0x7fffffff;
            auVar98._20_4_ = 0x7fffffff;
            auVar98._24_4_ = 0x7fffffff;
            auVar98._28_4_ = 0x7fffffff;
            auVar46 = vandps_avx(auVar98,ZEXT1632(auVar28));
            auVar100._8_4_ = 0x219392ef;
            auVar100._0_8_ = 0x219392ef219392ef;
            auVar100._12_4_ = 0x219392ef;
            auVar100._16_4_ = 0x219392ef;
            auVar100._20_4_ = 0x219392ef;
            auVar100._24_4_ = 0x219392ef;
            auVar100._28_4_ = 0x219392ef;
            uVar11 = vcmpps_avx512vl(auVar46,auVar100,1);
            bVar24 = (bool)((byte)uVar11 & 1);
            auVar49._0_4_ = (uint)bVar24 * 0x219392ef | (uint)!bVar24 * auVar28._0_4_;
            bVar24 = (bool)((byte)(uVar11 >> 1) & 1);
            auVar49._4_4_ = (uint)bVar24 * 0x219392ef | (uint)!bVar24 * auVar28._4_4_;
            bVar24 = (bool)((byte)(uVar11 >> 2) & 1);
            auVar49._8_4_ = (uint)bVar24 * 0x219392ef | (uint)!bVar24 * auVar28._8_4_;
            bVar24 = (bool)((byte)(uVar11 >> 3) & 1);
            auVar49._12_4_ = (uint)bVar24 * 0x219392ef | (uint)!bVar24 * auVar28._12_4_;
            auVar49._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * 0x219392ef;
            auVar49._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * 0x219392ef;
            auVar49._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * 0x219392ef;
            auVar49._28_4_ = (uint)(byte)(uVar11 >> 7) * 0x219392ef;
            auVar46 = vandps_avx(auVar98,ZEXT1632(auVar26));
            uVar11 = vcmpps_avx512vl(auVar46,auVar100,1);
            bVar24 = (bool)((byte)uVar11 & 1);
            auVar50._0_4_ = (uint)bVar24 * 0x219392ef | (uint)!bVar24 * auVar26._0_4_;
            bVar24 = (bool)((byte)(uVar11 >> 1) & 1);
            auVar50._4_4_ = (uint)bVar24 * 0x219392ef | (uint)!bVar24 * auVar26._4_4_;
            bVar24 = (bool)((byte)(uVar11 >> 2) & 1);
            auVar50._8_4_ = (uint)bVar24 * 0x219392ef | (uint)!bVar24 * auVar26._8_4_;
            bVar24 = (bool)((byte)(uVar11 >> 3) & 1);
            auVar50._12_4_ = (uint)bVar24 * 0x219392ef | (uint)!bVar24 * auVar26._12_4_;
            auVar50._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * 0x219392ef;
            auVar50._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * 0x219392ef;
            auVar50._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * 0x219392ef;
            auVar50._28_4_ = (uint)(byte)(uVar11 >> 7) * 0x219392ef;
            auVar46 = vandps_avx(auVar98,ZEXT1632(auVar27));
            uVar11 = vcmpps_avx512vl(auVar46,auVar100,1);
            bVar24 = (bool)((byte)uVar11 & 1);
            auVar51._0_4_ = (uint)bVar24 * 0x219392ef | (uint)!bVar24 * auVar27._0_4_;
            bVar24 = (bool)((byte)(uVar11 >> 1) & 1);
            auVar51._4_4_ = (uint)bVar24 * 0x219392ef | (uint)!bVar24 * auVar27._4_4_;
            bVar24 = (bool)((byte)(uVar11 >> 2) & 1);
            auVar51._8_4_ = (uint)bVar24 * 0x219392ef | (uint)!bVar24 * auVar27._8_4_;
            bVar24 = (bool)((byte)(uVar11 >> 3) & 1);
            auVar51._12_4_ = (uint)bVar24 * 0x219392ef | (uint)!bVar24 * auVar27._12_4_;
            auVar51._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * 0x219392ef;
            auVar51._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * 0x219392ef;
            auVar51._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * 0x219392ef;
            auVar51._28_4_ = (uint)(byte)(uVar11 >> 7) * 0x219392ef;
            auVar46 = vrcp14ps_avx512vl(auVar49);
            auVar99._8_4_ = 0x3f800000;
            auVar99._0_8_ = 0x3f8000003f800000;
            auVar99._12_4_ = 0x3f800000;
            auVar99._16_4_ = 0x3f800000;
            auVar99._20_4_ = 0x3f800000;
            auVar99._24_4_ = 0x3f800000;
            auVar99._28_4_ = 0x3f800000;
            auVar28 = vfnmadd213ps_fma(auVar49,auVar46,auVar99);
            auVar28 = vfmadd132ps_fma(ZEXT1632(auVar28),auVar46,auVar46);
            auVar46 = vrcp14ps_avx512vl(auVar50);
            auVar26 = vfnmadd213ps_fma(auVar50,auVar46,auVar99);
            auVar26 = vfmadd132ps_fma(ZEXT1632(auVar26),auVar46,auVar46);
            auVar46 = vrcp14ps_avx512vl(auVar51);
            auVar27 = vfnmadd213ps_fma(auVar51,auVar46,auVar99);
            auVar27 = vfmadd132ps_fma(ZEXT1632(auVar27),auVar46,auVar46);
            auVar43 = vfmadd213ps_avx512vl(auVar43,auVar35,*(undefined1 (*) [32])(uVar16 + 0x160));
            auVar44 = vfmadd213ps_avx512vl(auVar44,auVar35,*(undefined1 (*) [32])(uVar16 + 0x180));
            auVar45 = vfmadd213ps_avx512vl(auVar45,auVar35,*(undefined1 (*) [32])(uVar16 + 0x1a0));
            auVar43 = vfmadd231ps_avx512vl(auVar43,auVar34,*(undefined1 (*) [32])(uVar16 + 0xa0));
            auVar44 = vfmadd231ps_avx512vl(auVar44,auVar34,*(undefined1 (*) [32])(uVar16 + 0xc0));
            auVar45 = vfmadd231ps_avx512vl(auVar45,auVar34,*(undefined1 (*) [32])(uVar16 + 0xe0));
            auVar43 = vfmadd231ps_avx512vl(auVar43,auVar33,*(undefined1 (*) [32])(uVar16 + 0x40));
            fVar85 = -auVar28._0_4_ * auVar43._0_4_;
            fVar86 = -auVar28._4_4_ * auVar43._4_4_;
            auVar52._4_4_ = fVar86;
            auVar52._0_4_ = fVar85;
            fVar87 = -auVar28._8_4_ * auVar43._8_4_;
            auVar52._8_4_ = fVar87;
            fVar88 = -auVar28._12_4_ * auVar43._12_4_;
            auVar52._12_4_ = fVar88;
            fVar89 = auVar43._16_4_ * -0.0;
            auVar52._16_4_ = fVar89;
            fVar90 = auVar43._20_4_ * -0.0;
            auVar52._20_4_ = fVar90;
            fVar91 = auVar43._24_4_ * -0.0;
            auVar52._24_4_ = fVar91;
            auVar52._28_4_ = auVar43._28_4_;
            auVar44 = vfmadd231ps_avx512vl(auVar44,auVar33,*(undefined1 (*) [32])(uVar16 + 0x60));
            fVar75 = -auVar26._0_4_ * auVar44._0_4_;
            fVar79 = -auVar26._4_4_ * auVar44._4_4_;
            auVar9._4_4_ = fVar79;
            auVar9._0_4_ = fVar75;
            fVar80 = -auVar26._8_4_ * auVar44._8_4_;
            auVar9._8_4_ = fVar80;
            fVar81 = -auVar26._12_4_ * auVar44._12_4_;
            auVar9._12_4_ = fVar81;
            fVar82 = auVar44._16_4_ * -0.0;
            auVar9._16_4_ = fVar82;
            fVar83 = auVar44._20_4_ * -0.0;
            auVar9._20_4_ = fVar83;
            fVar84 = auVar44._24_4_ * -0.0;
            auVar9._24_4_ = fVar84;
            auVar9._28_4_ = auVar44._28_4_;
            auVar45 = vfmadd231ps_avx512vl(auVar45,auVar33,*(undefined1 (*) [32])(uVar16 + 0x80));
            fVar66 = -auVar27._0_4_ * auVar45._0_4_;
            fVar69 = -auVar27._4_4_ * auVar45._4_4_;
            auVar54._4_4_ = fVar69;
            auVar54._0_4_ = fVar66;
            fVar70 = -auVar27._8_4_ * auVar45._8_4_;
            auVar54._8_4_ = fVar70;
            fVar71 = -auVar27._12_4_ * auVar45._12_4_;
            auVar54._12_4_ = fVar71;
            fVar72 = auVar45._16_4_ * -0.0;
            auVar54._16_4_ = fVar72;
            fVar73 = auVar45._20_4_ * -0.0;
            auVar54._20_4_ = fVar73;
            fVar74 = auVar45._24_4_ * -0.0;
            auVar54._24_4_ = fVar74;
            auVar54._28_4_ = auVar45._28_4_;
            auVar56._0_4_ = auVar28._0_4_ + fVar85;
            auVar56._4_4_ = auVar28._4_4_ + fVar86;
            auVar56._8_4_ = auVar28._8_4_ + fVar87;
            auVar56._12_4_ = auVar28._12_4_ + fVar88;
            auVar56._16_4_ = fVar89 + 0.0;
            auVar56._20_4_ = fVar90 + 0.0;
            auVar56._24_4_ = fVar91 + 0.0;
            auVar56._28_4_ = auVar43._28_4_ + 0.0;
            auVar59._0_4_ = auVar26._0_4_ + fVar75;
            auVar59._4_4_ = auVar26._4_4_ + fVar79;
            auVar59._8_4_ = auVar26._8_4_ + fVar80;
            auVar59._12_4_ = auVar26._12_4_ + fVar81;
            auVar59._16_4_ = fVar82 + 0.0;
            auVar59._20_4_ = fVar83 + 0.0;
            auVar59._24_4_ = fVar84 + 0.0;
            auVar59._28_4_ = auVar44._28_4_ + 0.0;
            auVar65._0_4_ = auVar27._0_4_ + fVar66;
            auVar65._4_4_ = auVar27._4_4_ + fVar69;
            auVar65._8_4_ = auVar27._8_4_ + fVar70;
            auVar65._12_4_ = auVar27._12_4_ + fVar71;
            auVar65._16_4_ = fVar72 + 0.0;
            auVar65._20_4_ = fVar73 + 0.0;
            auVar65._24_4_ = fVar74 + 0.0;
            auVar65._28_4_ = auVar45._28_4_ + 0.0;
            auVar47 = vpminsd_avx2(auVar52,auVar56);
            auVar43 = vpminsd_avx2(auVar9,auVar59);
            auVar44 = vpminsd_avx2(auVar54,auVar65);
            auVar43 = vmaxps_avx(auVar43,auVar44);
            auVar45 = vpmaxsd_avx2(auVar52,auVar56);
            auVar44 = vpmaxsd_avx2(auVar9,auVar59);
            auVar46 = vpmaxsd_avx2(auVar54,auVar65);
            auVar44 = vminps_avx(auVar44,auVar46);
            auVar46 = vmaxps_avx512vl(auVar42,auVar47);
            auVar43 = vmaxps_avx(auVar46,auVar43);
            auVar45 = vminps_avx(auVar55._0_32_,auVar45);
            auVar44 = vminps_avx(auVar45,auVar44);
            auVar45._8_4_ = 0x3f7ffffa;
            auVar45._0_8_ = 0x3f7ffffa3f7ffffa;
            auVar45._12_4_ = 0x3f7ffffa;
            auVar45._16_4_ = 0x3f7ffffa;
            auVar45._20_4_ = 0x3f7ffffa;
            auVar45._24_4_ = 0x3f7ffffa;
            auVar45._28_4_ = 0x3f7ffffa;
            auVar43 = vmulps_avx512vl(auVar43,auVar45);
            auVar46._8_4_ = 0x3f800003;
            auVar46._0_8_ = 0x3f8000033f800003;
            auVar46._12_4_ = 0x3f800003;
            auVar46._16_4_ = 0x3f800003;
            auVar46._20_4_ = 0x3f800003;
            auVar46._24_4_ = 0x3f800003;
            auVar46._28_4_ = 0x3f800003;
            auVar44 = vmulps_avx512vl(auVar44,auVar46);
          }
          auVar60 = ZEXT3264(auVar44);
          auVar57 = ZEXT3264(auVar43);
          uVar11 = vcmpps_avx512vl(auVar43,auVar44,2);
          bVar20 = (byte)uVar11;
          if (bVar20 == 0) break;
          auVar44 = *(undefined1 (*) [32])(uVar19 & 0xfffffffffffffff0);
          auVar60 = ZEXT3264(auVar44);
          auVar45 = ((undefined1 (*) [32])(uVar19 & 0xfffffffffffffff0))[1];
          auVar46 = vmovdqa64_avx512vl(auVar101._0_32_);
          auVar46 = vpternlogd_avx512vl(auVar46,auVar43,auVar102._0_32_,0xf8);
          auVar47 = vpcompressd_avx512vl(auVar46);
          auVar48._0_4_ =
               (uint)(bVar20 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar20 & 1) * auVar46._0_4_;
          bVar24 = (bool)((byte)(uVar11 >> 1) & 1);
          auVar48._4_4_ = (uint)bVar24 * auVar47._4_4_ | (uint)!bVar24 * auVar46._4_4_;
          bVar24 = (bool)((byte)(uVar11 >> 2) & 1);
          auVar48._8_4_ = (uint)bVar24 * auVar47._8_4_ | (uint)!bVar24 * auVar46._8_4_;
          bVar24 = (bool)((byte)(uVar11 >> 3) & 1);
          auVar48._12_4_ = (uint)bVar24 * auVar47._12_4_ | (uint)!bVar24 * auVar46._12_4_;
          bVar24 = (bool)((byte)(uVar11 >> 4) & 1);
          auVar48._16_4_ = (uint)bVar24 * auVar47._16_4_ | (uint)!bVar24 * auVar46._16_4_;
          bVar24 = (bool)((byte)(uVar11 >> 5) & 1);
          auVar48._20_4_ = (uint)bVar24 * auVar47._20_4_ | (uint)!bVar24 * auVar46._20_4_;
          bVar24 = (bool)((byte)(uVar11 >> 6) & 1);
          auVar48._24_4_ = (uint)bVar24 * auVar47._24_4_ | (uint)!bVar24 * auVar46._24_4_;
          bVar24 = SUB81(uVar11 >> 7,0);
          auVar48._28_4_ = (uint)bVar24 * auVar47._28_4_ | (uint)!bVar24 * auVar46._28_4_;
          auVar46 = vpermt2q_avx512vl(auVar44,auVar48,auVar45);
          uVar19 = auVar46._0_8_;
          bVar20 = bVar20 - 1 & bVar20;
          if (bVar20 != 0) {
            auVar46 = vpshufd_avx2(auVar48,0x55);
            vpermt2q_avx512vl(auVar44,auVar46,auVar45);
            auVar47 = vpminsd_avx2(auVar48,auVar46);
            auVar46 = vpmaxsd_avx2(auVar48,auVar46);
            bVar20 = bVar20 - 1 & bVar20;
            if (bVar20 == 0) {
              auVar47 = vpermi2q_avx512vl(auVar47,auVar44,auVar45);
              uVar19 = auVar47._0_8_;
              auVar44 = vpermt2q_avx512vl(auVar44,auVar46,auVar45);
              auVar60 = ZEXT3264(auVar44);
              (pSVar21->ptr).ptr = auVar44._0_8_;
              lVar17 = 8;
              lStack_2580 = 0x10;
            }
            else {
              auVar9 = vpshufd_avx2(auVar48,0xaa);
              vpermt2q_avx512vl(auVar44,auVar9,auVar45);
              auVar52 = vpminsd_avx2(auVar47,auVar9);
              auVar47 = vpmaxsd_avx2(auVar47,auVar9);
              auVar9 = vpminsd_avx2(auVar46,auVar47);
              auVar47 = vpmaxsd_avx2(auVar46,auVar47);
              bVar20 = bVar20 - 1 & bVar20;
              if (bVar20 == 0) {
                auVar46 = vpermi2q_avx512vl(auVar52,auVar44,auVar45);
                uVar19 = auVar46._0_8_;
                auVar46 = vpermt2q_avx512vl(auVar44,auVar47,auVar45);
                (pSVar21->ptr).ptr = auVar46._0_8_;
                auVar46 = vpermd_avx2(auVar47,auVar43);
                pSVar21->dist = auVar46._0_4_;
                auVar44 = vpermt2q_avx512vl(auVar44,auVar9,auVar45);
                auVar60 = ZEXT3264(auVar44);
                pSVar21[1].ptr.ptr = auVar44._0_8_;
                lStack_2580 = 0x18;
                lVar17 = lStack_2580;
                lStack_2580 = 0x20;
                auVar46 = auVar9;
              }
              else {
                auVar46 = vpshufd_avx2(auVar48,0xff);
                vpermt2q_avx512vl(auVar44,auVar46,auVar45);
                auVar54 = vpminsd_avx2(auVar52,auVar46);
                auVar52 = vpmaxsd_avx2(auVar52,auVar46);
                auVar46 = vpminsd_avx2(auVar9,auVar52);
                auVar52 = vpmaxsd_avx2(auVar9,auVar52);
                auVar9 = vpminsd_avx2(auVar47,auVar52);
                auVar47 = vpmaxsd_avx2(auVar47,auVar52);
                bVar20 = bVar20 - 1 & bVar20;
                if (bVar20 != 0) {
                  auVar53 = valignd_avx512vl(auVar48,auVar48,3);
                  auVar52 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                  auVar54 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar52,auVar54);
                  auVar52 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar46 = vpermt2d_avx512vl(auVar54,auVar52,auVar46);
                  auVar52 = vpermt2d_avx512vl(auVar46,auVar52,auVar9);
                  auVar46 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar46 = vpermt2d_avx512vl(auVar52,auVar46,auVar47);
                  auVar78 = ZEXT3264(auVar46);
                  bVar18 = bVar20;
                  do {
                    auVar47 = auVar78._0_32_;
                    auVar77._8_4_ = 1;
                    auVar77._0_8_ = 0x100000001;
                    auVar77._12_4_ = 1;
                    auVar77._16_4_ = 1;
                    auVar77._20_4_ = 1;
                    auVar77._24_4_ = 1;
                    auVar77._28_4_ = 1;
                    auVar46 = vpermd_avx2(auVar77,auVar53);
                    auVar53 = valignd_avx512vl(auVar53,auVar53,1);
                    vpermt2q_avx512vl(auVar44,auVar53,auVar45);
                    bVar18 = bVar18 - 1 & bVar18;
                    uVar10 = vpcmpd_avx512vl(auVar46,auVar47,5);
                    auVar46 = vpmaxsd_avx2(auVar46,auVar47);
                    bVar12 = (byte)uVar10 << 1;
                    auVar47 = valignd_avx512vl(auVar47,auVar47,7);
                    bVar24 = (bool)((byte)uVar10 & 1);
                    bVar4 = (bool)(bVar12 >> 2 & 1);
                    bVar5 = (bool)(bVar12 >> 3 & 1);
                    bVar6 = (bool)(bVar12 >> 4 & 1);
                    bVar7 = (bool)(bVar12 >> 5 & 1);
                    bVar8 = (bool)(bVar12 >> 6 & 1);
                    auVar78 = ZEXT3264(CONCAT428((uint)(bVar12 >> 7) * auVar47._28_4_ |
                                                 (uint)!(bool)(bVar12 >> 7) * auVar46._28_4_,
                                                 CONCAT424((uint)bVar8 * auVar47._24_4_ |
                                                           (uint)!bVar8 * auVar46._24_4_,
                                                           CONCAT420((uint)bVar7 * auVar47._20_4_ |
                                                                     (uint)!bVar7 * auVar46._20_4_,
                                                                     CONCAT416((uint)bVar6 *
                                                                               auVar47._16_4_ |
                                                                               (uint)!bVar6 *
                                                                               auVar46._16_4_,
                                                                               CONCAT412((uint)bVar5
                                                                                         * auVar47.
                                                  _12_4_ | (uint)!bVar5 * auVar46._12_4_,
                                                  CONCAT48((uint)bVar4 * auVar47._8_4_ |
                                                           (uint)!bVar4 * auVar46._8_4_,
                                                           CONCAT44((uint)bVar24 * auVar47._4_4_ |
                                                                    (uint)!bVar24 * auVar46._4_4_,
                                                                    auVar46._0_4_))))))));
                  } while (bVar18 != 0);
                  lVar17 = (ulong)(uint)POPCOUNT((uint)bVar20) + 3;
                  while( true ) {
                    auVar47 = auVar78._0_32_;
                    auVar46 = vpermt2q_avx512vl(auVar44,auVar47,auVar45);
                    uVar19 = auVar46._0_8_;
                    bVar24 = lVar17 == 0;
                    lVar17 = lVar17 + -1;
                    if (bVar24) break;
                    (pSVar21->ptr).ptr = uVar19;
                    auVar46 = vpermd_avx2(auVar47,auVar43);
                    pSVar21->dist = auVar46._0_4_;
                    auVar46 = valignd_avx512vl(auVar47,auVar47,1);
                    auVar78 = ZEXT3264(auVar46);
                    pSVar21 = pSVar21 + 1;
                  }
                  goto LAB_01c5465f;
                }
                auVar52 = vpermi2q_avx512vl(auVar54,auVar44,auVar45);
                uVar19 = auVar52._0_8_;
                auVar52 = vpermt2q_avx512vl(auVar44,auVar47,auVar45);
                (pSVar21->ptr).ptr = auVar52._0_8_;
                auVar47 = vpermd_avx2(auVar47,auVar43);
                pSVar21->dist = auVar47._0_4_;
                auVar47 = vpermt2q_avx512vl(auVar44,auVar9,auVar45);
                pSVar21[1].ptr.ptr = auVar47._0_8_;
                auVar47 = vpermd_avx2(auVar9,auVar43);
                pSVar21[1].dist = auVar47._0_4_;
                auVar44 = vpermt2q_avx512vl(auVar44,auVar46,auVar45);
                auVar60 = ZEXT3264(auVar44);
                pSVar21[2].ptr.ptr = auVar44._0_8_;
                lVar17 = 0x28;
                lStack_2580 = 0x30;
              }
            }
            auVar43 = vpermd_avx2(auVar46,auVar43);
            auVar57 = ZEXT3264(auVar43);
            *(int *)((long)&(pSVar21->ptr).ptr + lVar17) = auVar43._0_4_;
            pSVar21 = (StackItemT<embree::NodeRefPtr<8>_> *)
                      ((long)&(pSVar21->ptr).ptr + lStack_2580);
          }
        } while( true );
      }
      goto LAB_01c54643;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }